

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeBeginTrans(Btree *p,int wrflag)

{
  int *piVar1;
  ushort uVar2;
  u32 uVar3;
  Pgno PVar4;
  BtShared *pBt_00;
  Wal *pWVar5;
  MemPage *pMVar6;
  sqlite3 *psVar7;
  _func_int_void_ptr_int *p_Var8;
  Pager *pPVar9;
  uint uVar10;
  char cVar11;
  byte bVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  MemPage *pPage1_1;
  int iVar16;
  BtLock *pBVar17;
  u16 uVar18;
  uint uVar19;
  Btree *pBVar20;
  u8 *puVar21;
  BtShared *pBt;
  uint uVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  MemPage *pPage1;
  int local_44;
  u32 *local_40;
  MemPage *local_38;
  
  pBt_00 = p->pBt;
  if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
    btreeLockCarefully(p);
  }
  iVar13 = 0;
  if (((p->inTrans == '\x02') || (iVar13 = 0, wrflag == 0 && p->inTrans == '\x01')) ||
     ((wrflag != 0 && (iVar13 = 8, (pBt_00->btsFlags & 1) != 0)))) goto LAB_001f0257;
  cVar11 = (char)pBt_00->btsFlags;
  if (wrflag == 0) {
    if (cVar11 < '\0') goto LAB_001efc58;
LAB_001efc36:
    bVar23 = true;
    if (1 < wrflag) {
      for (pBVar17 = pBt_00->pLock; pBVar17 != (BtLock *)0x0; pBVar17 = pBVar17->pNext) {
        pBVar20 = pBVar17->pBtree;
        if (pBVar20 != p) goto LAB_001efc5c;
      }
    }
  }
  else {
    if ((-1 < cVar11) && (pBt_00->inTransaction != '\x02')) goto LAB_001efc36;
LAB_001efc58:
    pBVar20 = pBt_00->pWriter;
LAB_001efc5c:
    bVar23 = pBVar20->db == (sqlite3 *)0x0;
  }
  iVar13 = 0x106;
  if ((bVar23) && (iVar13 = querySharedCacheTableLock(p,1,'\x01'), iVar13 == 0)) {
    uVar2 = pBt_00->btsFlags;
    pBt_00->btsFlags = uVar2 & 0xffef;
    if (pBt_00->nPage == 0) {
      pBt_00->btsFlags = uVar2 | 0x10;
    }
    local_40 = &pBt_00->pageSize;
    iVar13 = 0;
    do {
      if (pBt_00->pPage1 == (MemPage *)0x0) {
        do {
          iVar15 = sqlite3PagerSharedLock(pBt_00->pPager);
          if ((iVar15 == 0) &&
             (iVar15 = btreeGetPage(pBt_00,1,&local_38,0), pMVar6 = local_38, iVar15 == 0)) {
            puVar21 = local_38->aData;
            uVar22 = *(uint *)(puVar21 + 0x1c);
            uVar22 = uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
                     uVar22 << 0x18;
            uVar3 = pBt_00->pPager->dbSize;
            if ((uVar22 == 0) || (*(int *)(puVar21 + 0x18) != *(int *)(puVar21 + 0x5c))) {
              uVar22 = uVar3;
            }
            if ((int)uVar22 < 1) {
LAB_001efd49:
              uVar3 = pBt_00->usableSize;
              uVar14 = (uVar3 * 0x40 - 0x300) / 0xff - 0x17;
              pBt_00->maxLocal = (u16)uVar14;
              uVar18 = (short)((uVar3 * 0x20 - 0x180) / 0xff) - 0x17;
              pBt_00->minLocal = uVar18;
              pBt_00->maxLeaf = (short)uVar3 - 0x23;
              pBt_00->minLeaf = uVar18;
              if ((uVar14 & 0xffff) < 0x80) {
                pBt_00->max1bytePayload = (u8)uVar14;
              }
              else {
                pBt_00->max1bytePayload = '\x7f';
              }
              pBt_00->pPage1 = pMVar6;
              pBt_00->nPage = uVar22;
              iVar15 = 0;
            }
            else {
              auVar24[0] = -(*puVar21 == 'S');
              auVar24[1] = -(puVar21[1] == 'Q');
              auVar24[2] = -(puVar21[2] == 'L');
              auVar24[3] = -(puVar21[3] == 'i');
              auVar24[4] = -(puVar21[4] == 't');
              auVar24[5] = -(puVar21[5] == 'e');
              auVar24[6] = -(puVar21[6] == ' ');
              auVar24[7] = -(puVar21[7] == 'f');
              auVar24[8] = -(puVar21[8] == 'o');
              auVar24[9] = -(puVar21[9] == 'r');
              auVar24[10] = -(puVar21[10] == 'm');
              auVar24[0xb] = -(puVar21[0xb] == 'a');
              auVar24[0xc] = -(puVar21[0xc] == 't');
              auVar24[0xd] = -(puVar21[0xd] == ' ');
              auVar24[0xe] = -(puVar21[0xe] == '3');
              auVar24[0xf] = -(puVar21[0xf] == '\0');
              iVar15 = 0x1a;
              if ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar24[0xf] >> 7) << 0xf) == 0xffff) {
                if (2 < puVar21[0x12]) {
                  *(byte *)&pBt_00->btsFlags = (byte)pBt_00->btsFlags | 1;
                }
                if (2 < puVar21[0x13]) goto LAB_001efd37;
                if ((puVar21[0x13] == 2) && ((pBt_00->btsFlags & 0x20) == 0)) {
                  local_44 = 0;
                  iVar15 = sqlite3PagerOpenWal(pBt_00->pPager,&local_44);
                  iVar13 = 0;
                  if (iVar15 == 0) {
                    if (local_44 == 0) {
                      if (pMVar6 != (MemPage *)0x0) {
                        sqlite3PagerUnrefNotNull(pMVar6->pDbPage);
                      }
                      iVar16 = 1;
                      bVar23 = false;
                      iVar15 = 0;
                    }
                    else {
                      iVar15 = 0x1a;
                      iVar16 = 0;
                      bVar23 = true;
                    }
                  }
                  else {
                    iVar16 = 2;
                    bVar23 = false;
                  }
                  if (bVar23) goto LAB_001efe5f;
                  goto LAB_001efd3c;
                }
LAB_001efe5f:
                if (puVar21[0x17] == ' ' && *(short *)(puVar21 + 0x15) == 0x2040) {
                  uVar10 = (uint)puVar21[0x10] * 0x100;
                  uVar14 = (uint)puVar21[0x11] * 0x10000;
                  if (((uVar14 + uVar10) - 0x10001 < 0xffff0100) ||
                     (uVar19 = uVar14 | uVar10, ((uVar10 + uVar14) - 1 & uVar19) != 0))
                  goto LAB_001efe7b;
                  bVar12 = puVar21[0x14];
                  uVar14 = uVar19 - bVar12;
                  if (uVar19 == *local_40) {
                    if (((pBt_00->db->flags & 1) == 0) && ((int)uVar3 < (int)uVar22)) {
                      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xf48d,
                                  "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34"
                                 );
                      iVar15 = 0xb;
                    }
                    else if (0x1df < uVar14) {
                      pBt_00->pageSize = uVar19;
                      pBt_00->usableSize = uVar14;
                      uVar14 = *(uint *)(puVar21 + 0x34);
                      pBt_00->autoVacuum =
                           ((uVar14 >> 0x18 != 0 || (uVar14 & 0xff0000) != 0) ||
                           (uVar14 & 0xff00) != 0) || (uVar14 & 0xff) != 0;
                      uVar14 = *(uint *)(puVar21 + 0x40);
                      pBt_00->incrVacuum =
                           ((uVar14 >> 0x18 != 0 || (uVar14 & 0xff0000) != 0) ||
                           (uVar14 & 0xff00) != 0) || (uVar14 & 0xff) != 0;
                      iVar16 = 0;
                      iVar13 = 0;
                      goto LAB_001efd3c;
                    }
                    goto LAB_001efe7b;
                  }
                  if (pMVar6 != (MemPage *)0x0) {
                    sqlite3PagerUnrefNotNull(pMVar6->pDbPage);
                  }
                  pBt_00->usableSize = uVar14;
                  pBt_00->pageSize = uVar19;
                  if (pBt_00->pTmpSpace != (u8 *)0x0) {
                    puVar21 = pBt_00->pTmpSpace + -4;
                    pBt_00->pTmpSpace = puVar21;
                    pcache1Free(puVar21);
                    pBt_00->pTmpSpace = (u8 *)0x0;
                  }
                  iVar13 = sqlite3PagerSetPagesize(pBt_00->pPager,local_40,(uint)bVar12);
                  iVar16 = 1;
                  iVar15 = iVar13;
                }
                else {
LAB_001efe7b:
                  iVar13 = 0;
                  iVar16 = 2;
                }
              }
              else {
LAB_001efd37:
                iVar16 = 2;
                iVar15 = 0x1a;
              }
LAB_001efd3c:
              if (iVar16 == 2) {
                if (pMVar6 != (MemPage *)0x0) {
                  sqlite3PagerUnrefNotNull(pMVar6->pDbPage);
                }
                pBt_00->pPage1 = (MemPage *)0x0;
              }
              else {
                iVar15 = iVar13;
                if (iVar16 == 0) goto LAB_001efd49;
              }
            }
          }
          iVar13 = iVar15;
          if (iVar13 != 0) goto LAB_001f0001;
        } while (pBt_00->pPage1 == (MemPage *)0x0);
        iVar13 = 0;
      }
LAB_001f0001:
      if (((wrflag != 0) && (iVar13 == 0)) && (iVar13 = 8, (pBt_00->btsFlags & 1) == 0)) {
        pPVar9 = pBt_00->pPager;
        iVar13 = pPVar9->errCode;
        if (iVar13 == 0) {
          pPVar9->subjInMemory = p->db->temp_store == '\x02';
          iVar13 = 0;
          if (pPVar9->eState == '\x01') {
            if (pPVar9->pWal == (Wal *)0x0) {
              iVar13 = pagerLockDb(pPVar9,2);
              if (iVar13 == 0 && 1 < wrflag) {
                do {
                  iVar13 = pagerLockDb(pPVar9,4);
                  if (iVar13 != 5) break;
                  iVar15 = (*pPVar9->xBusyHandler)(pPVar9->pBusyHandlerArg);
                } while (iVar15 != 0);
              }
            }
            else {
              if ((pPVar9->exclusiveMode != '\0') && (pPVar9->pWal->exclusiveMode == '\0')) {
                iVar13 = pagerLockDb(pPVar9,4);
                if (iVar13 != 0) goto LAB_001f01c8;
                pWVar5 = pPVar9->pWal;
                if (pWVar5->exclusiveMode == '\0') {
                  (*pWVar5->pDbFd->pMethods->xShmLock)(pWVar5->pDbFd,pWVar5->readLock + 3,1,5);
                }
                pWVar5->exclusiveMode = '\x01';
              }
              pWVar5 = pPVar9->pWal;
              iVar13 = 8;
              if (pWVar5->readOnly == '\0') {
                iVar13 = 0;
                if (pWVar5->exclusiveMode == '\0') {
                  iVar13 = (*pWVar5->pDbFd->pMethods->xShmLock)(pWVar5->pDbFd,0,1,10);
                }
                if (iVar13 == 0) {
                  pWVar5->writeLock = '\x01';
                  iVar13 = bcmp(&pWVar5->hdr,*pWVar5->apWiData,0x30);
                  if (iVar13 == 0) {
                    iVar13 = 0;
                  }
                  else {
                    if (pWVar5->exclusiveMode == '\0') {
                      (*pWVar5->pDbFd->pMethods->xShmLock)(pWVar5->pDbFd,0,1,9);
                    }
                    pWVar5->writeLock = '\0';
                    iVar13 = 0x205;
                  }
                }
              }
            }
            if (iVar13 == 0) {
              pPVar9->eState = '\x02';
              PVar4 = pPVar9->dbSize;
              pPVar9->dbHintSize = PVar4;
              pPVar9->dbFileSize = PVar4;
              pPVar9->dbOrigSize = PVar4;
              pPVar9->journalOff = 0;
              iVar13 = 0;
            }
          }
        }
LAB_001f01c8:
        if (iVar13 == 0) {
          iVar13 = newDatabase(pBt_00);
        }
      }
      if (((iVar13 != 0) && (pBt_00->inTransaction == '\0')) &&
         (pMVar6 = pBt_00->pPage1, pMVar6 != (MemPage *)0x0)) {
        pBt_00->pPage1 = (MemPage *)0x0;
        sqlite3PagerUnrefNotNull(pMVar6->pDbPage);
      }
      if (((char)iVar13 != '\x05') || (pBt_00->inTransaction != '\0')) goto LAB_001f0252;
      psVar7 = pBt_00->db;
      p_Var8 = (psVar7->busyHandler).xFunc;
      if ((p_Var8 == (_func_int_void_ptr_int *)0x0) ||
         (iVar15 = (psVar7->busyHandler).nBusy, iVar15 < 0)) goto LAB_001f0252;
      iVar15 = (*p_Var8)((psVar7->busyHandler).pArg,iVar15);
      if (iVar15 == 0) {
        iVar16 = -1;
      }
      else {
        iVar16 = (psVar7->busyHandler).nBusy + 1;
      }
      (psVar7->busyHandler).nBusy = iVar16;
      if (iVar15 == 0) goto LAB_001f0252;
    } while( true );
  }
LAB_001f0257:
  if ((wrflag != 0) && (iVar13 == 0)) {
    pPVar9 = pBt_00->pPager;
    iVar15 = p->db->nSavepoint;
    iVar13 = 0;
    if ((pPVar9->nSavepoint < iVar15) && (pPVar9->useJournal != '\0')) {
      iVar13 = pagerOpenSavepoint(pPVar9,iVar15);
    }
  }
  if (p->sharable != '\0') {
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      unlockBtreeMutex(p);
    }
  }
  return iVar13;
LAB_001f0252:
  if (iVar13 == 0) {
    if ((p->inTrans == '\0') &&
       (pBt_00->nTransaction = pBt_00->nTransaction + 1, p->sharable != '\0')) {
      (p->lock).eLock = '\x01';
      (p->lock).pNext = pBt_00->pLock;
      pBt_00->pLock = &p->lock;
    }
    bVar12 = 2 - (wrflag == 0);
    p->inTrans = bVar12;
    if (pBt_00->inTransaction < bVar12) {
      pBt_00->inTransaction = bVar12;
    }
    iVar13 = 0;
    if (wrflag != 0) {
      pMVar6 = pBt_00->pPage1;
      pBt_00->pWriter = p;
      pBt_00->btsFlags = (ushort)(1 < wrflag) << 6 | pBt_00->btsFlags & 0xffbf;
      uVar22 = *(uint *)(pMVar6->aData + 0x1c);
      iVar13 = 0;
      if ((pBt_00->nPage !=
           (uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 | uVar22 << 0x18)) &&
         (iVar13 = sqlite3PagerWrite(pMVar6->pDbPage), iVar13 == 0)) {
        uVar22 = pBt_00->nPage;
        *(uint *)(pMVar6->aData + 0x1c) =
             uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 | uVar22 << 0x18;
        iVar13 = 0;
      }
    }
  }
  goto LAB_001f0257;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeBeginTrans(Btree *p, int wrflag){
  BtShared *pBt = p->pBt;
  int rc = SQLITE_OK;

  sqlite3BtreeEnter(p);
  btreeIntegrity(p);

  /* If the btree is already in a write-transaction, or it
  ** is already in a read-transaction and a read-transaction
  ** is requested, this is a no-op.
  */
  if( p->inTrans==TRANS_WRITE || (p->inTrans==TRANS_READ && !wrflag) ){
    goto trans_begun;
  }
  assert( pBt->inTransaction==TRANS_WRITE || IfNotOmitAV(pBt->bDoTruncate)==0 );

  /* Write transactions are not possible on a read-only database */
  if( (pBt->btsFlags & BTS_READ_ONLY)!=0 && wrflag ){
    rc = SQLITE_READONLY;
    goto trans_begun;
  }

#ifndef SQLITE_OMIT_SHARED_CACHE
  {
    sqlite3 *pBlock = 0;
    /* If another database handle has already opened a write transaction 
    ** on this shared-btree structure and a second write transaction is
    ** requested, return SQLITE_LOCKED.
    */
    if( (wrflag && pBt->inTransaction==TRANS_WRITE)
     || (pBt->btsFlags & BTS_PENDING)!=0
    ){
      pBlock = pBt->pWriter->db;
    }else if( wrflag>1 ){
      BtLock *pIter;
      for(pIter=pBt->pLock; pIter; pIter=pIter->pNext){
        if( pIter->pBtree!=p ){
          pBlock = pIter->pBtree->db;
          break;
        }
      }
    }
    if( pBlock ){
      sqlite3ConnectionBlocked(p->db, pBlock);
      rc = SQLITE_LOCKED_SHAREDCACHE;
      goto trans_begun;
    }
  }
#endif

  /* Any read-only or read-write transaction implies a read-lock on 
  ** page 1. So if some other shared-cache client already has a write-lock 
  ** on page 1, the transaction cannot be opened. */
  rc = querySharedCacheTableLock(p, MASTER_ROOT, READ_LOCK);
  if( SQLITE_OK!=rc ) goto trans_begun;

  pBt->btsFlags &= ~BTS_INITIALLY_EMPTY;
  if( pBt->nPage==0 ) pBt->btsFlags |= BTS_INITIALLY_EMPTY;
  do {
    /* Call lockBtree() until either pBt->pPage1 is populated or
    ** lockBtree() returns something other than SQLITE_OK. lockBtree()
    ** may return SQLITE_OK but leave pBt->pPage1 set to 0 if after
    ** reading page 1 it discovers that the page-size of the database 
    ** file is not pBt->pageSize. In this case lockBtree() will update
    ** pBt->pageSize to the page-size of the file on disk.
    */
    while( pBt->pPage1==0 && SQLITE_OK==(rc = lockBtree(pBt)) );

    if( rc==SQLITE_OK && wrflag ){
      if( (pBt->btsFlags & BTS_READ_ONLY)!=0 ){
        rc = SQLITE_READONLY;
      }else{
        rc = sqlite3PagerBegin(pBt->pPager,wrflag>1,sqlite3TempInMemory(p->db));
        if( rc==SQLITE_OK ){
          rc = newDatabase(pBt);
        }
      }
    }
  
    if( rc!=SQLITE_OK ){
      unlockBtreeIfUnused(pBt);
    }
  }while( (rc&0xFF)==SQLITE_BUSY && pBt->inTransaction==TRANS_NONE &&
          btreeInvokeBusyHandler(pBt) );

  if( rc==SQLITE_OK ){
    if( p->inTrans==TRANS_NONE ){
      pBt->nTransaction++;
#ifndef SQLITE_OMIT_SHARED_CACHE
      if( p->sharable ){
        assert( p->lock.pBtree==p && p->lock.iTable==1 );
        p->lock.eLock = READ_LOCK;
        p->lock.pNext = pBt->pLock;
        pBt->pLock = &p->lock;
      }
#endif
    }
    p->inTrans = (wrflag?TRANS_WRITE:TRANS_READ);
    if( p->inTrans>pBt->inTransaction ){
      pBt->inTransaction = p->inTrans;
    }
    if( wrflag ){
      MemPage *pPage1 = pBt->pPage1;
#ifndef SQLITE_OMIT_SHARED_CACHE
      assert( !pBt->pWriter );
      pBt->pWriter = p;
      pBt->btsFlags &= ~BTS_EXCLUSIVE;
      if( wrflag>1 ) pBt->btsFlags |= BTS_EXCLUSIVE;
#endif

      /* If the db-size header field is incorrect (as it may be if an old
      ** client has been writing the database file), update it now. Doing
      ** this sooner rather than later means the database size can safely 
      ** re-read the database size from page 1 if a savepoint or transaction
      ** rollback occurs within the transaction.
      */
      if( pBt->nPage!=get4byte(&pPage1->aData[28]) ){
        rc = sqlite3PagerWrite(pPage1->pDbPage);
        if( rc==SQLITE_OK ){
          put4byte(&pPage1->aData[28], pBt->nPage);
        }
      }
    }
  }


trans_begun:
  if( rc==SQLITE_OK && wrflag ){
    /* This call makes sure that the pager has the correct number of
    ** open savepoints. If the second parameter is greater than 0 and
    ** the sub-journal is not already open, then it will be opened here.
    */
    rc = sqlite3PagerOpenSavepoint(pBt->pPager, p->db->nSavepoint);
  }

  btreeIntegrity(p);
  sqlite3BtreeLeave(p);
  return rc;
}